

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions.hpp
# Opt level: O0

size_t std::experimental::detail::index_into_dynamic_dims<int,unsigned_long>
                 (int idx,unsigned_long head)

{
  undefined4 local_2c;
  undefined8 local_28;
  undefined4 local_1c;
  unsigned_long head_local;
  int idx_local;
  
  if ((head == 0xffffffffffffffff) && (idx != 0)) {
    if (idx == 0) {
      local_1c = 0;
    }
    else {
      local_1c = idx + -1;
    }
    local_28 = index_into_dynamic_dims<int>(local_1c);
    local_28 = local_28 + 1;
  }
  else {
    if (idx == 0) {
      local_2c = 0;
    }
    else {
      local_2c = idx + -1;
    }
    local_28 = index_into_dynamic_dims<int>(local_2c);
  }
  return local_28;
}

Assistant:

inline constexpr std::size_t index_into_dynamic_dims(
    Idx idx, Head head, Tail... tail
    ) noexcept
{
    return
        // FIXME: Is idx != 0 needed
        ( head == dyn && idx != 0
        ? index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...) + 1
        : index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...)
        );
}